

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluj.c
# Opt level: O0

int ffgcluj(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
           long elemincre,int nultyp,unsigned_long nulval,unsigned_long *array,char *nularray,
           int *anynul,int *status)

{
  int iVar1;
  uint in_ESI;
  size_t in_R8;
  FITSfile *in_R9;
  fitsfile *values;
  fitsfile *output;
  fitsfile *incre_00;
  int in_stack_00000008;
  unsigned_long in_stack_00000010;
  long in_stack_00000018;
  void *in_stack_00000020;
  fitsfile *in_stack_00000028;
  fitsfile *in_stack_00000030;
  void *buffer;
  double cbuff [3600];
  char snull [20];
  char message [81];
  char tform [20];
  LONGLONG maxelem;
  LONGLONG rowincre;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG tnull;
  LONGLONG readptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  int nulcheck;
  long ntodo;
  long xwidth;
  long ii;
  long incre;
  long twidth;
  int decimals;
  int xcode;
  int hdutype;
  int maxelem2;
  int tcode;
  double dtemp;
  double power;
  double zero;
  double scale;
  fitsfile *nvals;
  fitsfile *fptr_00;
  fitsfile *fptr_01;
  long *status_00;
  long *buffer_00;
  int *offset;
  fitsfile *fptr_02;
  char *gsize;
  fitsfile *fptr_03;
  size_t local_7298;
  size_t local_7288;
  fitsfile *nullval;
  fitsfile *snull_00;
  fitsfile *pfVar2;
  double *input;
  int *in_stack_ffffffffffff8db8;
  undefined4 in_stack_ffffffffffff8dc0;
  int in_stack_ffffffffffff8dc4;
  fitsfile *in_stack_ffffffffffff8dc8;
  int *in_stack_ffffffffffff8dd0;
  char *in_stack_ffffffffffff8dd8;
  double *in_stack_ffffffffffff8de0;
  double *in_stack_ffffffffffff8de8;
  char *in_stack_ffffffffffff8df0;
  long *in_stack_ffffffffffff8df8;
  unsigned_long *in_stack_ffffffffffff8e00;
  int *in_stack_ffffffffffff8e08;
  LONGLONG *in_stack_ffffffffffff8e10;
  LONGLONG *in_stack_ffffffffffff8e18;
  long *in_stack_ffffffffffff8e20;
  LONGLONG *in_stack_ffffffffffff8e28;
  LONGLONG *in_stack_ffffffffffff8e30;
  int *in_stack_ffffffffffff8e38;
  LONGLONG *in_stack_ffffffffffff8e40;
  char *in_stack_ffffffffffff8e48;
  int *in_stack_ffffffffffff8e50;
  char local_1c8 [32];
  char local_1a8 [96];
  fitsfile local_148 [2];
  size_t local_128;
  long local_120;
  long local_118;
  size_t local_110;
  long local_108;
  long local_100;
  fitsfile local_f8;
  long local_e8;
  long local_e0;
  long local_d8;
  int local_cc;
  size_t local_c8;
  long local_b8;
  long local_b0;
  fitsfile local_a8;
  int local_94;
  undefined1 local_90 [8];
  FITSfile *local_88;
  double local_80;
  double local_78;
  FITSfile *local_70;
  FITSfile *local_68;
  size_t local_60;
  uint local_44;
  int local_34;
  
  local_80 = 1.0;
  if ((in_stack_00000030->HDUposition < 1) && (in_R8 != 0)) {
    input = (double *)&stack0xffffffffffff8db8;
    if (in_stack_00000028 != (fitsfile *)0x0) {
      in_stack_00000028->HDUposition = 0;
    }
    local_68 = in_R9;
    local_60 = in_R8;
    local_44 = in_ESI;
    if (in_stack_00000008 == 2) {
      memset(in_stack_00000020,0,in_R8);
    }
    incre_00 = local_148;
    gsize = local_1c8;
    output = (fitsfile *)&local_70;
    values = (fitsfile *)&local_78;
    nvals = &local_a8;
    fptr_00 = (fitsfile *)(local_90 + 4);
    fptr_01 = (fitsfile *)local_90;
    status_00 = &local_d8;
    buffer_00 = &local_100;
    offset = &local_94;
    fptr_02 = &local_f8;
    fptr_03 = in_stack_00000030;
    nullval = fptr_00;
    snull_00 = fptr_01;
    pfVar2 = in_stack_00000030;
    iVar1 = ffgcprll(in_stack_ffffffffffff8dc8,in_stack_ffffffffffff8dc4,
                     (LONGLONG)in_stack_ffffffffffff8db8,(LONGLONG)input,(LONGLONG)in_stack_00000030
                     ,(int)((ulong)fptr_01 >> 0x20),in_stack_ffffffffffff8de0,
                     in_stack_ffffffffffff8de8,in_stack_ffffffffffff8df0,in_stack_ffffffffffff8df8,
                     (int *)in_stack_ffffffffffff8e00,in_stack_ffffffffffff8e08,
                     in_stack_ffffffffffff8e10,in_stack_ffffffffffff8e18,in_stack_ffffffffffff8e20,
                     in_stack_ffffffffffff8e28,in_stack_ffffffffffff8e30,in_stack_ffffffffffff8e38,
                     in_stack_ffffffffffff8e40,in_stack_ffffffffffff8e48,in_stack_ffffffffffff8e50);
    if (iVar1 < 1) {
      local_128 = (size_t)(int)local_90._0_4_;
      local_b0 = (long)local_68 * local_b0;
      if (local_90._4_4_ == 0x10) {
        ffasfm(in_stack_ffffffffffff8dd8,in_stack_ffffffffffff8dd0,(long *)in_stack_ffffffffffff8dc8
               ,(int *)CONCAT44(in_stack_ffffffffffff8dc4,in_stack_ffffffffffff8dc0),
               in_stack_ffffffffffff8db8);
        for (local_b8 = 0; local_b8 < local_a8.Fptr._4_4_; local_b8 = local_b8 + 1) {
          local_80 = local_80 * 10.0;
        }
      }
      local_cc = in_stack_00000008;
      if ((in_stack_00000008 == 1) && (in_stack_00000010 == 0)) {
        local_cc = 0;
      }
      else if (((int)local_90._4_4_ % 10 == 1) && (local_f8._0_8_ == 0x4995cdd1)) {
        local_cc = 0;
      }
      else if ((local_90._4_4_ == 0x15) &&
              ((0x7fff < (long)local_f8._0_8_ || ((long)local_f8._0_8_ < -0x8000)))) {
        local_cc = 0;
      }
      else if ((local_90._4_4_ == 0xb) &&
              ((0xff < (long)local_f8._0_8_ || ((long)local_f8._0_8_ < 0)))) {
        local_cc = 0;
      }
      else if ((local_90._4_4_ == 0x10) && (local_1c8[0] == '\x01')) {
        local_cc = 0;
      }
      local_110 = local_60;
      local_118 = 0;
      local_108 = 0;
      while (local_110 != 0) {
        if ((long)local_110 < (long)local_128) {
          local_7288 = local_110;
        }
        else {
          local_7288 = local_128;
        }
        if ((long)local_7288 < ((local_d8 - local_e8) + -1) / (long)local_68 + 1) {
          local_7298 = local_7288;
        }
        else {
          local_7298 = ((local_d8 - local_e8) + -1) / (long)local_68 + 1;
        }
        local_c8 = local_7298;
        local_f8.Fptr =
             (FITSfile *)(local_e0 + local_108 * local_100 + local_e8 * (local_b0 / (long)local_68))
        ;
        if (local_90._4_4_ == 0xb) {
          ffgi1b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(uchar *)values,
                 &output->HDUposition);
          values = (fitsfile *)(in_stack_00000018 + local_118 * 8);
          output = in_stack_00000028;
          incre_00 = in_stack_00000030;
          fffi1u4((uchar *)input,local_c8,(double)local_70,local_78,local_cc,
                  (uchar)local_f8.HDUposition,in_stack_00000010,
                  (char *)((long)in_stack_00000020 + local_118),&in_stack_00000028->HDUposition,
                  (unsigned_long *)values,&in_stack_00000030->HDUposition);
        }
        else if (local_90._4_4_ == 0x10) {
          ffmbyt(fptr_00,(LONGLONG)nvals,(int)((ulong)incre_00 >> 0x20),&values->HDUposition);
          if (local_b0 == local_a8._0_8_) {
            ffgbyt(fptr_02,(LONGLONG)offset,buffer_00,(int *)status_00);
          }
          else {
            ffgbytoff(fptr_03,(long)gsize,(long)fptr_02,(long)offset,buffer_00,(int *)status_00);
          }
          output = (fitsfile *)((long)in_stack_00000020 + local_118);
          incre_00 = (fitsfile *)(in_stack_00000018 + local_118 * 8);
          values = in_stack_00000028;
          nvals = in_stack_00000030;
          fffstru4(in_stack_ffffffffffff8dd8,(long)in_stack_ffffffffffff8dd0,
                   (double)in_stack_ffffffffffff8dc8,
                   (double)CONCAT44(in_stack_ffffffffffff8dc4,in_stack_ffffffffffff8dc0),
                   (long)in_stack_ffffffffffff8db8,(double)input,(int)((ulong)pfVar2 >> 0x20),
                   (char *)snull_00,(unsigned_long)nullval,in_stack_ffffffffffff8df0,
                   (int *)in_stack_ffffffffffff8df8,in_stack_ffffffffffff8e00,
                   in_stack_ffffffffffff8e08);
        }
        else if (local_90._4_4_ == 0x15) {
          ffgi2b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(short *)values,
                 &output->HDUposition);
          values = (fitsfile *)(in_stack_00000018 + local_118 * 8);
          output = in_stack_00000028;
          incre_00 = in_stack_00000030;
          fffi2u4((short *)input,local_c8,(double)local_70,local_78,local_cc,
                  (short)local_f8.HDUposition,in_stack_00000010,
                  (char *)((long)in_stack_00000020 + local_118),&in_stack_00000028->HDUposition,
                  (unsigned_long *)values,&in_stack_00000030->HDUposition);
        }
        else if (local_90._4_4_ == 0x29) {
          ffgi4b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,&values->HDUposition,
                 &output->HDUposition);
          values = (fitsfile *)(in_stack_00000018 + local_118 * 8);
          output = in_stack_00000028;
          incre_00 = in_stack_00000030;
          fffi4u4((int *)input,local_c8,(double)local_70,local_78,local_cc,local_f8.HDUposition,
                  in_stack_00000010,(char *)((long)in_stack_00000020 + local_118),
                  &in_stack_00000028->HDUposition,(unsigned_long *)values,
                  &in_stack_00000030->HDUposition);
        }
        else if (local_90._4_4_ == 0x2a) {
          ffgr4b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(float *)values,
                 &output->HDUposition);
          output = (fitsfile *)(in_stack_00000018 + local_118 * 8);
          values = in_stack_00000030;
          fffr4u4((float *)input,local_c8,(double)local_70,local_78,local_cc,in_stack_00000010,
                  (char *)((long)in_stack_00000020 + local_118),&in_stack_00000028->HDUposition,
                  (unsigned_long *)output,&in_stack_00000030->HDUposition);
        }
        else if (local_90._4_4_ == 0x51) {
          ffgi8b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(long *)values,
                 &output->HDUposition);
          values = (fitsfile *)(in_stack_00000018 + local_118 * 8);
          output = in_stack_00000028;
          incre_00 = in_stack_00000030;
          fffi8u4((LONGLONG *)input,local_c8,(double)local_70,local_78,local_cc,local_f8._0_8_,
                  in_stack_00000010,(char *)((long)in_stack_00000020 + local_118),
                  &in_stack_00000028->HDUposition,(unsigned_long *)values,
                  &in_stack_00000030->HDUposition);
        }
        else {
          if (local_90._4_4_ != 0x52) {
            snprintf(local_1a8,0x51,"Cannot read numbers from column %d which has format %s",
                     (ulong)local_44,local_148);
            ffpmsg((char *)0x1acac9);
            if (local_94 == 1) {
              in_stack_00000030->HDUposition = 0x137;
              return 0x137;
            }
            in_stack_00000030->HDUposition = 0x138;
            return 0x138;
          }
          ffgr8b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(double *)values,
                 &output->HDUposition);
          output = (fitsfile *)(in_stack_00000018 + local_118 * 8);
          values = in_stack_00000030;
          fffr8u4(input,local_c8,(double)local_70,local_78,local_cc,in_stack_00000010,
                  (char *)((long)in_stack_00000020 + local_118),&in_stack_00000028->HDUposition,
                  (unsigned_long *)output,&in_stack_00000030->HDUposition);
        }
        if (0 < in_stack_00000030->HDUposition) {
          local_88 = (FITSfile *)(double)local_118;
          if (local_94 < 1) {
            snprintf(local_1a8,0x51,"Error reading elements %.0f thru %.0f from image (ffgcluj).",
                     (double)local_88 + 1.0,(double)local_88 + (double)(long)local_c8);
          }
          else {
            snprintf(local_1a8,0x51,
                     "Error reading elements %.0f thru %.0f from column %d (ffgcluj).",
                     (double)local_88 + 1.0,(double)local_88 + (double)(long)local_c8,
                     (ulong)local_44);
          }
          ffpmsg((char *)0x1acbd9);
          return in_stack_00000030->HDUposition;
        }
        local_110 = local_110 - local_c8;
        if (local_110 != 0) {
          local_118 = local_c8 + local_118;
          local_e8 = local_e8 + local_c8 * (long)local_68;
          if (local_d8 <= local_e8) {
            local_120 = local_e8 / local_d8;
            local_108 = local_120 + local_108;
            local_e8 = local_e8 - local_120 * local_d8;
          }
        }
      }
      if (in_stack_00000030->HDUposition == -0xb) {
        ffpmsg((char *)0x1accdd);
        in_stack_00000030->HDUposition = 0x19c;
      }
      local_34 = in_stack_00000030->HDUposition;
    }
    else {
      local_34 = in_stack_00000030->HDUposition;
    }
  }
  else {
    local_34 = in_stack_00000030->HDUposition;
  }
  return local_34;
}

Assistant:

int ffgcluj(fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG  firstelem, /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            long  elemincre,  /* I - pixel increment; e.g., 2 = every other  */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
   unsigned long  nulval,     /* I - value for null pixels if nultyp = 1     */
   unsigned long  *array,     /* O - array of values that are read           */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer be a virtual column in a 1 or more grouped FITS primary
  array or image extension.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The output array of values will be converted from the datatype of the column 
  and will be scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    double scale, zero, power = 1., dtemp;
    int tcode, maxelem2, hdutype, xcode, decimals;
    long twidth, incre;
    long ii, xwidth, ntodo;
    int nulcheck;
    LONGLONG repeat, startpos, elemnum, readptr, tnull;
    LONGLONG rowlen, rownum, remain, next, rowincre, maxelem;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value if reading from ASCII table  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    if (anynul)
        *anynul = 0;

    if (nultyp == 2)
        memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if ( ffgcprll( fptr, colnum, firstrow, firstelem, nelem, 0, &scale, &zero,
         tform, &twidth, &tcode, &maxelem2, &startpos, &elemnum, &incre,
         &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0 )
         return(*status);
    maxelem = maxelem2;

    incre *= elemincre;   /* multiply incre to just get every nth pixel */

    if (tcode == TSTRING)    /* setup for ASCII tables */
    {
      /* get the number of implied decimal places if no explicit decmal point */
      ffasfm(tform, &xcode, &xwidth, &decimals, status); 
      for(ii = 0; ii < decimals; ii++)
        power *= 10.;
    }
    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (tcode%10 == 1 &&        /* if reading an integer column, and  */ 
            tnull == NULL_UNDEFINED) /* if a null value is not defined,    */
            nulcheck = 0;            /* then do not check for null values. */

    else if (tcode == TSHORT && (tnull > SHRT_MAX || tnull < SHRT_MIN) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TBYTE && (tnull > 255 || tnull < 0) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TSTRING && snull[0] == ASCII_NULL_UNDEFINED)
         nulcheck = 0;

    /*----------------------------------------------------------------------*/
    /*  If FITS column and output data array have same datatype, then we do */
    /*  not need to use a temporary buffer to store intermediate datatype.  */
    /*----------------------------------------------------------------------*/
    if ((tcode == TLONG) && (LONGSIZE == 32))  /* Special Case:                        */
    {                             /* no type convertion required, so read */
                                  /* data directly into output buffer.    */

        if (nelem < (LONGLONG)INT32_MAX/4) {
            maxelem = nelem;
        } else {
            maxelem = INT32_MAX/4;
        }
    }

    /*---------------------------------------------------------------------*/
    /*  Now read the pixels from the FITS column. If the column does not   */
    /*  have the same datatype as the output array, then we have to read   */
    /*  the raw values into a temporary buffer (of limited size).  In      */
    /*  the case of a vector colum read only 1 vector of values at a time  */
    /*  then skip to the next row if more values need to be read.          */
    /*  After reading the raw values, then call the fffXXYY routine to (1) */
    /*  test for undefined values, (2) convert the datatype if necessary,  */
    /*  and (3) scale the values by the FITS TSCALn and TZEROn linear      */
    /*  scaling parameters.                                                */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to read */
    next = 0;                 /* next element in array to be read   */
    rownum = 0;               /* row number, relative to firstrow   */

    while (remain)
    {
        /* limit the number of pixels to read at one time to the number that
           will fit in the buffer or to the number of pixels that remain in
           the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);      
        ntodo = (long) minvalue(ntodo, ((repeat - elemnum - 1)/elemincre +1));

        readptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * (incre / elemincre));

        switch (tcode) 
        {
            case (TLONG):
	      if (LONGSIZE == 32) {
                ffgi4b(fptr, readptr, ntodo, incre, (INT32BIT *) &array[next],
                       status);
                fffi4u4((INT32BIT *) &array[next], ntodo, scale, zero,
                         nulcheck, (INT32BIT) tnull, nulval, &nularray[next],
                         anynul, &array[next], status);
	      } else { /* case where sizeof(long) = 8 */
                ffgi4b(fptr, readptr, ntodo, incre, (INT32BIT *) buffer,
                       status);
                fffi4u4((INT32BIT *) buffer, ntodo, scale, zero,
                         nulcheck, (INT32BIT) tnull, nulval, &nularray[next],
                         anynul, &array[next], status);
	      }


                break;
            case (TLONGLONG):

                ffgi8b(fptr, readptr, ntodo, incre, (long *) buffer, status);
                fffi8u4( (LONGLONG *) buffer, ntodo, scale, zero, 
                           nulcheck, tnull, nulval, &nularray[next], 
                            anynul, &array[next], status);
                break;
            case (TBYTE):
                ffgi1b(fptr, readptr, ntodo, incre, (unsigned char *) buffer,
                       status);
                fffi1u4((unsigned char *) buffer, ntodo, scale, zero, nulcheck, 
                     (unsigned char) tnull, nulval, &nularray[next], anynul, 
                     &array[next], status);
                break;
            case (TSHORT):
                ffgi2b(fptr, readptr, ntodo, incre, (short  *) buffer, status);
                fffi2u4((short  *) buffer, ntodo, scale, zero, nulcheck, 
                      (short) tnull, nulval, &nularray[next], anynul, 
                      &array[next], status);
                break;
            case (TFLOAT):
                ffgr4b(fptr, readptr, ntodo, incre, (float  *) buffer, status);
                fffr4u4((float  *) buffer, ntodo, scale, zero, nulcheck, 
                       nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TDOUBLE):
                ffgr8b(fptr, readptr, ntodo, incre, (double *) buffer, status);
                fffr8u4((double *) buffer, ntodo, scale, zero, nulcheck, 
                          nulval, &nularray[next], anynul, 
                          &array[next], status);
                break;
            case (TSTRING):
                ffmbyt(fptr, readptr, REPORT_EOF, status);
       
                if (incre == twidth)    /* contiguous bytes */
                     ffgbyt(fptr, ntodo * twidth, buffer, status);
                else
                     ffgbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);

                fffstru4((char *) buffer, ntodo, scale, zero, twidth, power,
                     nulcheck, snull, nulval, &nularray[next], anynul,
                     &array[next], status);
                break;

            default:  /*  error trap for invalid column format */
                snprintf(message,FLEN_ERRMSG, 
                   "Cannot read numbers from column %d which has format %s",
                    colnum, tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous read operation */
        {
	  dtemp = (double) next;
          if (hdutype > 0)
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from column %d (ffgcluj).",
              dtemp+1., dtemp+ntodo, colnum);
          else
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from image (ffgcluj).",
              dtemp+1., dtemp+ntodo);

          ffpmsg(message);
          return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum = elemnum + (ntodo * elemincre);

            if (elemnum >= repeat)  /* completed a row; start on later row */
            {
                rowincre = elemnum / repeat;
                rownum += rowincre;
                elemnum = elemnum - (rowincre * repeat);
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
        ffpmsg(
        "Numerical overflow during type conversion while reading FITS data.");
        *status = NUM_OVERFLOW;
    }

    return(*status);
}